

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardFF8.cpp
# Opt level: O0

void leopard::ff8::FFT_DIT(uint64_t bytes,void **work,uint m_truncated,uint m,ffe_t *skewLUT)

{
  uint in_ECX;
  uint in_EDX;
  long in_R8;
  ffe_t log_m;
  uint r_1;
  uint i;
  ffe_t log_m23;
  ffe_t log_m02;
  ffe_t log_m01;
  uint i_end;
  uint r;
  uint dist;
  uint dist4;
  uint64_t in_stack_000000f8;
  void *in_stack_00000100;
  void *in_stack_00000108;
  uint64_t in_stack_00000298;
  ffe_t in_stack_000002a7;
  void *in_stack_000002a8;
  void *in_stack_000002b0;
  ffe_t in_stack_000003c1;
  ffe_t in_stack_000003c2;
  ffe_t in_stack_000003c3;
  uint in_stack_000003c4;
  void **in_stack_000003c8;
  uint64_t in_stack_000003d0;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  local_24 = in_ECX;
  for (local_28 = in_ECX >> 2; local_28 != 0; local_28 = local_28 >> 2) {
    for (local_2c = 0; local_2c < in_EDX; local_2c = local_24 + local_2c) {
      for (local_38 = local_2c; local_38 < local_2c + local_28; local_38 = local_38 + 1) {
        FFT_DIT4(in_stack_000003d0,in_stack_000003c8,in_stack_000003c4,in_stack_000003c3,
                 in_stack_000003c2,in_stack_000003c1);
      }
    }
    local_24 = local_28;
  }
  if (local_24 == 2) {
    for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 2) {
      if (*(char *)(in_R8 + (ulong)(local_3c + 1)) == -1) {
        xor_mem(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
      }
      else {
        FFT_DIT2(in_stack_000002b0,in_stack_000002a8,in_stack_000002a7,in_stack_00000298);
      }
    }
  }
  return;
}

Assistant:

static void FFT_DIT(
    const uint64_t bytes,
    void** work,
    const unsigned m_truncated,
    const unsigned m,
    const ffe_t* skewLUT)
{
    // Decimation in time: Unroll 2 layers at a time
    unsigned dist4 = m, dist = m >> 2;
    for (; dist != 0; dist4 = dist, dist >>= 2)
    {
        // For each set of dist*4 elements:
        for (unsigned r = 0; r < m_truncated; r += dist4)
        {
            const unsigned i_end = r + dist;
            const ffe_t log_m01 = skewLUT[i_end];
            const ffe_t log_m02 = skewLUT[i_end + dist];
            const ffe_t log_m23 = skewLUT[i_end + dist * 2];

            // For each set of dist elements:
            for (unsigned i = r; i < i_end; ++i)
            {
                FFT_DIT4(
                    bytes,
                    work + i,
                    dist,
                    log_m01,
                    log_m23,
                    log_m02);
            }
        }
    }

    // If there is one layer left:
    if (dist4 == 2)
    {
        for (unsigned r = 0; r < m_truncated; r += 2)
        {
            const ffe_t log_m = skewLUT[r + 1];

            if (log_m == kModulus)
                xor_mem(work[r + 1], work[r], bytes);
            else
            {
                FFT_DIT2(
                    work[r],
                    work[r + 1],
                    log_m,
                    bytes);
            }
        }
    }
}